

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this,size_type expected_max_items_in_table,TransparentHasher *hf,
                 TransparentHasher *eql,Identity *ext,SetKey *set,
                 Alloc<int,_unsigned_long,_18446744073709551615UL> *alloc)

{
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4> *this_00;
  long in_RSI;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *in_stack_00000008;
  TransparentHasher *in_stack_ffffffffffffff68;
  SetKey *in_stack_ffffffffffffff70;
  Identity *in_stack_ffffffffffffff78;
  ValInfo *this_01;
  KeyInfo *in_stack_ffffffffffffff80;
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL> *this_02;
  size_type local_78;
  size_type in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
  *in_stack_ffffffffffffffb0;
  alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_> local_40 [3];
  long local_10;
  
  local_10 = in_RSI;
  Settings::Settings((Settings *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  KeyInfo::KeyInfo(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68);
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  if (local_10 == 0) {
    local_78 = 0x20;
  }
  else {
    local_78 = sparsehash_internal::
               sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::
               min_buckets(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa0);
  }
  in_RDI->num_buckets = local_78;
  this_01 = &in_RDI->val_info;
  this_02 = (Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL> *)
            &stack0xffffffffffffffb0;
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>::Alloc<int>
            (this_02,in_stack_00000008);
  alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>::alloc_impl
            (local_40,this_02);
  ValInfo::ValInfo(this_01,local_40);
  alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>::~alloc_impl
            ((alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_> *)
             0xa91d6b);
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL> *)
             &stack0xffffffffffffffb0);
  in_RDI->table = (pointer)0x0;
  this_00 = (sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4> *)
            bucket_count(in_RDI);
  sparsehash_internal::
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::reset_thresholds
            (this_00,(size_type)in_RDI);
  return;
}

Assistant:

explicit dense_hashtable(size_type expected_max_items_in_table = 0,
                           const HashFcn& hf = HashFcn(),
                           const EqualKey& eql = EqualKey(),
                           const ExtractKey& ext = ExtractKey(),
                           const SetKey& set = SetKey(),
                           const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        num_elements(0),
        num_buckets(expected_max_items_in_table == 0
                        ? HT_DEFAULT_STARTING_BUCKETS
                        : settings.min_buckets(expected_max_items_in_table, 0)),
        val_info(alloc_impl<value_alloc_type>(alloc)),
        table(NULL) {
    // table is NULL until emptyval is set.  However, we set num_buckets
    // here so we know how much space to allocate once emptyval is set
    settings.reset_thresholds(bucket_count());
  }